

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O1

string * __thiscall
glcts::ViewportArray::DrawTestBase::getVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,DrawTestBase *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\nvoid main()\n{\n    /* empty */;\n}\n\n","");
  return __return_storage_ptr__;
}

Assistant:

std::string DrawTestBase::getVertexShader()
{
	static const GLchar* source = "${VERSION}\n"
								  "\n"
								  "void main()\n"
								  "{\n"
								  "    /* empty */;\n"
								  "}\n"
								  "\n";

	std::string result = source;

	return result;
}